

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_pack.c
# Opt level: O2

void taia_pack(char *s,taia *t)

{
  uint uVar1;
  
  tai_pack(s,&t->sec);
  uVar1 = (uint)t->atto;
  *(uint *)(s + 0xc) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uint)t->nano;
  *(uint *)(s + 8) = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
  ;
  return;
}

Assistant:

void taia_pack(char *s,const struct taia *t)
{
  unsigned long x;

  tai_pack(s,&t->sec);
  s += 8;

  x = t->atto;
  s[7] = x & 255; x >>= 8;
  s[6] = x & 255; x >>= 8;
  s[5] = x & 255; x >>= 8;
  s[4] = x;
  x = t->nano;
  s[3] = x & 255; x >>= 8;
  s[2] = x & 255; x >>= 8;
  s[1] = x & 255; x >>= 8;
  s[0] = x;
}